

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

void glfwInitAllocator(GLFWallocator *allocator)

{
  GLFWallocator *allocator_local;
  
  if (allocator == (GLFWallocator *)0x0) {
    memset(&_glfwInitAllocator,0,0x20);
  }
  else if (((allocator->allocate == (GLFWallocatefun)0x0) ||
           (allocator->reallocate == (GLFWreallocatefun)0x0)) ||
          (allocator->deallocate == (GLFWdeallocatefun)0x0)) {
    _glfwInputError(0x10004,"Missing function in allocator");
  }
  else {
    _glfwInitAllocator.allocate = allocator->allocate;
    _glfwInitAllocator.reallocate = allocator->reallocate;
    _glfwInitAllocator.deallocate = allocator->deallocate;
    _glfwInitAllocator.user = allocator->user;
  }
  return;
}

Assistant:

GLFWAPI void glfwInitAllocator(const GLFWallocator* allocator)
{
    if (allocator)
    {
        if (allocator->allocate && allocator->reallocate && allocator->deallocate)
            _glfwInitAllocator = *allocator;
        else
            _glfwInputError(GLFW_INVALID_VALUE, "Missing function in allocator");
    }
    else
        memset(&_glfwInitAllocator, 0, sizeof(GLFWallocator));
}